

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hh
# Opt level: O1

fixed_depth_iterator * __thiscall
tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
fixed_depth_iterator::operator++(fixed_depth_iterator *this)

{
  tree_node_<libDAI::BoundTreeNode> *ptVar1;
  tree_node_<libDAI::BoundTreeNode> *ptVar2;
  int relative_depth;
  int iVar3;
  
  ptVar2 = ((this->super_iterator_base).node)->next_sibling;
  if (ptVar2 == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
    ptVar2 = (this->super_iterator_base).node;
    iVar3 = 0;
LAB_004994da:
    ptVar2 = ptVar2->parent;
    if (ptVar2 != (tree_node_<libDAI::BoundTreeNode> *)0x0) {
      iVar3 = iVar3 + -1;
      if (ptVar2->next_sibling != (tree_node_<libDAI::BoundTreeNode> *)0x0) {
        (this->super_iterator_base).node = ptVar2;
        do {
          ptVar1 = ptVar2->next_sibling;
          while (ptVar2 = ptVar1, ptVar2->first_child == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
            ptVar1 = ptVar2->next_sibling;
            if (ptVar2->next_sibling == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
              (this->super_iterator_base).node = ptVar2;
              goto LAB_004994da;
            }
          }
          (this->super_iterator_base).node = ptVar2;
          if (-1 < iVar3) {
            return this;
          }
          while (ptVar1 = ptVar2->first_child, ptVar1 != (tree_node_<libDAI::BoundTreeNode> *)0x0) {
            (this->super_iterator_base).node = ptVar1;
            iVar3 = iVar3 + 1;
            ptVar2 = ptVar1;
            if (iVar3 == 0) {
              return this;
            }
          }
        } while (ptVar2->next_sibling != (tree_node_<libDAI::BoundTreeNode> *)0x0);
      }
      goto LAB_004994da;
    }
  }
  (this->super_iterator_base).node = ptVar2;
  return this;
}

Assistant:

typename tree<T, tree_node_allocator>::fixed_depth_iterator& tree<T, tree_node_allocator>::fixed_depth_iterator::operator++()
   {
   assert(this->node!=0);

   if(this->node->next_sibling) {
      this->node=this->node->next_sibling;
      }
   else { 
      int relative_depth=0;
      upper:
      do {
         this->node=this->node->parent;
         if(this->node==0) return *this;
         --relative_depth;
         } while(this->node->next_sibling==0);
      lower:
      this->node=this->node->next_sibling;
      while(this->node->first_child==0) {
         if(this->node->next_sibling==0)
            goto upper;
         this->node=this->node->next_sibling;
         if(this->node==0) return *this;
         }
      while(relative_depth<0 && this->node->first_child!=0) {
         this->node=this->node->first_child;
         ++relative_depth;
         }
      if(relative_depth<0) {
         if(this->node->next_sibling==0) goto upper;
         else                          goto lower;
         }
      }
   return *this;

// if(this->node->next_sibling!=0) {
//    this->node=this->node->next_sibling;
//    assert(this->node!=0);
//    if(this->node->parent==0 && this->node->next_sibling==0) // feet element
//       this->node=0;
//    }
// else {
//    tree_node *par=this->node->parent;
//    do {
//       par=par->next_sibling;
//       if(par==0) { // FIXME: need to keep track of this!
//          this->node=0;
//          return *this;
//          }
//       } while(par->first_child==0);
//    this->node=par->first_child;
//    }
   return *this;
   }